

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

void * __thiscall ON_FixedSizePool::AllocateDirtyElement(ON_FixedSizePool *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  ON_FixedSizePool *pOVar3;
  ulong uVar4;
  int line_number;
  
  puVar2 = (undefined8 *)this->m_al_element_stack;
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)this->m_al_block;
    uVar1 = this->m_al_count;
    if (uVar1 == 0 || puVar2 == (undefined8 *)0x0) {
      if ((puVar2 == (undefined8 *)0x0) ||
         (puVar2 = (undefined8 *)*puVar2, puVar2 == (undefined8 *)0x0)) {
        if (this->m_sizeof_element == 0) {
          line_number = 0x15c;
LAB_004aa24e:
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                     ,line_number,"",
                     "ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool"
                    );
          return (void *)0x0;
        }
        if (uVar1 == 0) {
          uVar1 = this->m_block_element_count;
          this->m_al_count = uVar1;
          if (uVar1 == 0) {
            line_number = 0x165;
            goto LAB_004aa24e;
          }
        }
        puVar2 = (undefined8 *)onmalloc(uVar1 * this->m_sizeof_element + 0x10);
        *puVar2 = 0;
        uVar4 = this->m_sizeof_element;
        puVar2[1] = (long)puVar2 + this->m_al_count * uVar4 + 0x10;
        pOVar3 = this;
        if (this->m_first_block != (void *)0x0) {
          pOVar3 = (ON_FixedSizePool *)this->m_al_block;
        }
        pOVar3->m_first_block = puVar2;
        this->m_al_block = puVar2;
        uVar1 = this->m_al_count;
      }
      else {
        this->m_al_block = puVar2;
        uVar4 = this->m_sizeof_element;
        if (uVar4 == 0) {
          uVar1 = 0;
        }
        else {
          uVar1 = ((puVar2[1] - (long)puVar2) - 0x10U) / uVar4;
        }
      }
      puVar2 = puVar2 + 2;
    }
    else {
      puVar2 = (undefined8 *)this->m_al_element_array;
      uVar4 = this->m_sizeof_element;
    }
    this->m_al_count = uVar1 - 1;
    this->m_al_element_array = (void *)(uVar4 + (long)puVar2);
    this->m_total_element_count = this->m_total_element_count + 1;
  }
  else {
    this->m_al_element_stack = (void *)*puVar2;
  }
  this->m_active_element_count = this->m_active_element_count + 1;
  return puVar2;
}

Assistant:

void* ON_FixedSizePool::AllocateDirtyElement()
{
  void* p;

  if ( 0 != m_al_element_stack )
  {
    // use item on the returned stack first.
    p = m_al_element_stack;
    m_al_element_stack = *((void**)m_al_element_stack);
  }
  else
  {
    if ( 0 == m_al_block || 0 == m_al_count )
    {
      // No more memory left in m_al_block.
      void* next_block = (0 != m_al_block)
                       ? *((void**)m_al_block)
                       : 0;
      if ( 0 == next_block )
      {
        // This if clause is used when we need to allocate a new block from the heap
        if ( 0 == m_sizeof_element )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }
        // allocate a new block
        if ( 0 == m_al_count )
          m_al_count = m_block_element_count;

        if ( m_al_count <= 0 )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }

        p = onmalloc( 2*sizeof(void*) + m_al_count*m_sizeof_element ); // get some heap

        // set "next" pointer to zero
        *((void**)p) = nullptr;

        // set "end" pointer to address after last byte in the block
        *((void**)(((char*)p) + sizeof(void*))) = ((char*)p) + (2*sizeof(void*) + m_al_count*m_sizeof_element);
        if ( 0 == m_first_block )
        {
          m_first_block = p;
          // If the call to Create() specified a positive element_count_estimate,
          // then m_sizeof_block needs to be reset for any future block allocations.

        }
        else
        {
          // If m_first_block != 0, then m_al_block is nonzero (or memory for this class has been trashed)
          *((void**)m_al_block) = p;
        }
        m_al_block = p;
      }
      else
      {
        // If we get here, ReturnAll() was used at some point in
        // the past, m_al_block != 0, m_al_count = zero, and we are
        // reusing blocks that were allocated early.
        m_al_block = next_block;
        m_al_count = BlockElementCapacity(m_al_block);
      }

      m_al_element_array = (void*)(((char*)m_al_block)+2*sizeof(void*));
    }
    m_al_count--;
    p = m_al_element_array;
    m_al_element_array = (void*)(((char*)m_al_element_array) + m_sizeof_element);
    m_total_element_count++;
  }

  m_active_element_count++;

  return p;
}